

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<QString,_const_QLatin1Char_&>,_QString> *this)

{
  QString::~QString((QString *)0x578020);
  QStringBuilder<QString,_const_QLatin1Char_&>::~QStringBuilder
            ((QStringBuilder<QString,_const_QLatin1Char_&> *)0x57802a);
  return;
}

Assistant:

~QStringBuilder() = default;